

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,std::unique_ptr<google::protobuf::TextFormat::MessagePrinter_const,std::default_delete<google::protobuf::TextFormat::MessagePrinter_const>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::MessagePrinter_const,std::default_delete<google::protobuf::TextFormat::MessagePrinter_const>>>>>
::find_or_prepare_insert_soo<google::protobuf::Descriptor_const*>
          (pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,std::unique_ptr<google::protobuf::TextFormat::MessagePrinter_const,std::default_delete<google::protobuf::TextFormat::MessagePrinter_const>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::MessagePrinter_const,std::default_delete<google::protobuf::TextFormat::MessagePrinter_const>>>>>
          *this,Descriptor **key)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  anon_union_8_1_a8a14541_for_iterator_2 aVar3;
  slot_type *psVar4;
  size_t i;
  uintptr_t v;
  bool bVar5;
  iterator iVar6;
  
  if (*(ulong *)(this + 8) < 2) {
    if (*(long *)this != 1) {
      if (*(long *)this == 0) {
        __assert_fail("!kEnabled || cap >= kCapacity",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xb37,
                      "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>>>::capacity() const [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>>]"
                     );
      }
      __assert_fail("is_soo()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xdc5,
                    "HashtablezInfoHandle absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>>>::try_sample_soo() [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, std::unique_ptr<const google::protobuf::TextFormat::MessagePrinter>>>]"
                   );
    }
    CommonFields::AssertInSooMode((CommonFields *)this);
    *(undefined8 *)(this + 8) = 2;
    aVar3.slot_ = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
                  ::soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
                              *)this);
    bVar5 = true;
    iVar6.field_1.slot_ = aVar3.slot_;
    iVar6.ctrl_ = (ctrl_t *)&kSooControl;
  }
  else {
    psVar4 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
             ::soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
                         *)this);
    if ((psVar4->value).first == *key) {
      aVar3.slot_ = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
                    ::soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
                                *)this);
      iVar6.field_1.slot_ = aVar3.slot_;
      iVar6.ctrl_ = (ctrl_t *)&kSooControl;
      bVar5 = false;
    }
    else {
      raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
      ::resize_impl(this,3);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (long)*key;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = &(*key)->super_SymbolBase +
                     (SUB168(auVar1 * ZEXT816(0x9ddfea08eb382d69),0) ^
                     SUB168(auVar1 * ZEXT816(0x9ddfea08eb382d69),8));
      i = absl::lts_20240722::container_internal::PrepareInsertAfterSoo
                    (SUB168(auVar2 * ZEXT816(0x9ddfea08eb382d69),8) ^
                     SUB168(auVar2 * ZEXT816(0x9ddfea08eb382d69),0),0x10,(CommonFields *)this);
      iVar6 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
              ::iterator_at((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::MessagePrinter,_std::default_delete<const_google::protobuf::TextFormat::MessagePrinter>_>_>_>_>
                             *)this,i);
      bVar5 = true;
    }
  }
  __return_storage_ptr__->first = iVar6;
  __return_storage_ptr__->second = bVar5;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_soo(const K& key) {
    if (empty()) {
      const HashtablezInfoHandle infoz = try_sample_soo();
      if (infoz.IsSampled()) {
        resize_with_soo_infoz(infoz);
      } else {
        common().set_full_soo();
        return {soo_iterator(), true};
      }
    } else if (PolicyTraits::apply(EqualElement<K>{key, eq_ref()},
                                   PolicyTraits::element(soo_slot()))) {
      return {soo_iterator(), false};
    } else {
      resize(NextCapacity(SooCapacity()));
    }
    const size_t index =
        PrepareInsertAfterSoo(hash_ref()(key), sizeof(slot_type), common());
    return {iterator_at(index), true};
  }